

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::_::RawSchema_*> * __thiscall
kj::ArrayBuilder<capnp::_::RawSchema_*>::operator=
          (ArrayBuilder<capnp::_::RawSchema_*> *this,ArrayBuilder<capnp::_::RawSchema_*> *other)

{
  ArrayBuilder<capnp::_::RawSchema_*> *other_local;
  ArrayBuilder<capnp::_::RawSchema_*> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (RawSchema **)0x0;
  other->pos = (RemoveConst<capnp::_::RawSchema_*> *)0x0;
  other->endPtr = (RawSchema **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }